

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O2

bool __thiscall jpgd::jpeg_decoder::calc_mcu_block_order(jpeg_decoder *this)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  bool bVar11;
  
  uVar4 = 0;
  uVar6 = (ulong)(uint)this->m_comps_in_frame;
  if (this->m_comps_in_frame < 1) {
    uVar6 = uVar4;
  }
  iVar9 = 0;
  iVar8 = 0;
  for (; uVar6 != uVar4; uVar4 = uVar4 + 1) {
    if (iVar9 < this->m_comp_h_samp[uVar4]) {
      iVar9 = this->m_comp_h_samp[uVar4];
    }
    if (iVar8 < this->m_comp_v_samp[uVar4]) {
      iVar8 = this->m_comp_v_samp[uVar4];
    }
  }
  iVar2 = this->m_image_x_size;
  iVar3 = this->m_image_y_size;
  for (uVar4 = 0; uVar6 != uVar4; uVar4 = uVar4 + 1) {
    this->m_comp_h_blocks[uVar4] =
         ((this->m_comp_h_samp[uVar4] * iVar2 + iVar9 + -1) / iVar9 + 7) / 8;
    this->m_comp_v_blocks[uVar4] =
         ((this->m_comp_v_samp[uVar4] * iVar3 + iVar8 + -1) / iVar8 + 7) / 8;
  }
  iVar10 = this->m_comps_in_scan;
  if (iVar10 == 1) {
    iVar9 = this->m_comp_list[0];
    this->m_mcus_per_row = this->m_comp_h_blocks[iVar9];
    this->m_mcus_per_col = this->m_comp_v_blocks[iVar9];
    this->m_mcu_org[0] = iVar9;
    this->m_blocks_per_mcu = 1;
    uVar7 = 1;
  }
  else {
    this->m_mcus_per_row = ((iVar2 + 7) / 8 + iVar9 + -1) / iVar9;
    this->m_mcus_per_col = ((iVar3 + 7) / 8 + iVar8 + -1) / iVar8;
    this->m_blocks_per_mcu = 0;
    for (lVar5 = 0; lVar5 < iVar10; lVar5 = lVar5 + 1) {
      iVar9 = this->m_comp_list[lVar5];
      iVar8 = this->m_comp_v_samp[iVar9] * this->m_comp_h_samp[iVar9];
      while (bVar11 = iVar8 != 0, iVar8 = iVar8 + -1, bVar11) {
        iVar2 = this->m_blocks_per_mcu;
        this->m_blocks_per_mcu = iVar2 + 1;
        this->m_mcu_org[iVar2] = iVar9;
      }
      iVar10 = this->m_comps_in_scan;
    }
    uVar7 = this->m_blocks_per_mcu;
  }
  uVar6 = 0;
  if ((int)uVar7 <= this->m_max_blocks_per_mcu) {
    uVar4 = (ulong)uVar7;
    if ((int)uVar7 < 1) {
      uVar4 = uVar6;
    }
    do {
      if (uVar4 == uVar6) {
        return (long)(int)uVar7 <= (long)uVar6;
      }
      piVar1 = this->m_mcu_org + uVar6;
      uVar6 = uVar6 + 1;
    } while (*piVar1 < 4);
  }
  return false;
}

Assistant:

bool jpeg_decoder::calc_mcu_block_order()
	{
		int component_num, component_id;
		int max_h_samp = 0, max_v_samp = 0;

		for (component_id = 0; component_id < m_comps_in_frame; component_id++)
		{
			if (m_comp_h_samp[component_id] > max_h_samp)
				max_h_samp = m_comp_h_samp[component_id];

			if (m_comp_v_samp[component_id] > max_v_samp)
				max_v_samp = m_comp_v_samp[component_id];
		}

		for (component_id = 0; component_id < m_comps_in_frame; component_id++)
		{
			m_comp_h_blocks[component_id] = ((((m_image_x_size * m_comp_h_samp[component_id]) + (max_h_samp - 1)) / max_h_samp) + 7) / 8;
			m_comp_v_blocks[component_id] = ((((m_image_y_size * m_comp_v_samp[component_id]) + (max_v_samp - 1)) / max_v_samp) + 7) / 8;
		}

		if (m_comps_in_scan == 1)
		{
			m_mcus_per_row = m_comp_h_blocks[m_comp_list[0]];
			m_mcus_per_col = m_comp_v_blocks[m_comp_list[0]];
		}
		else
		{
			m_mcus_per_row = (((m_image_x_size + 7) / 8) + (max_h_samp - 1)) / max_h_samp;
			m_mcus_per_col = (((m_image_y_size + 7) / 8) + (max_v_samp - 1)) / max_v_samp;
		}

		if (m_comps_in_scan == 1)
		{
			m_mcu_org[0] = m_comp_list[0];

			m_blocks_per_mcu = 1;
		}
		else
		{
			m_blocks_per_mcu = 0;

			for (component_num = 0; component_num < m_comps_in_scan; component_num++)
			{
				int num_blocks;

				component_id = m_comp_list[component_num];

				num_blocks = m_comp_h_samp[component_id] * m_comp_v_samp[component_id];

				while (num_blocks--)
					m_mcu_org[m_blocks_per_mcu++] = component_id;
			}
		}

		if (m_blocks_per_mcu > m_max_blocks_per_mcu)
			return false;

		for (int mcu_block = 0; mcu_block < m_blocks_per_mcu; mcu_block++)
		{
			int comp_id = m_mcu_org[mcu_block];
			if (comp_id >= JPGD_MAX_QUANT_TABLES)
				return false;
		}

		return true;
	}